

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O2

void compute_integral_img_int(uint8_t *gray_image,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  long lVar5;
  size_t i_1;
  int iVar6;
  uint8_t *puVar7;
  size_t i;
  long lVar8;
  float fVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  undefined1 in_XMM2 [16];
  
  pfVar4 = iimage->data;
  iVar1 = iimage->data_width;
  lVar5 = (long)iimage->width;
  iVar2 = iimage->height;
  fVar9 = 0.0;
  for (lVar8 = 0; lVar5 != lVar8; lVar8 = lVar8 + 1) {
    fVar9 = (float)((int)fVar9 + (uint)gray_image[lVar8]);
    pfVar4[lVar8] = fVar9;
  }
  puVar7 = gray_image + lVar5;
  pfVar12 = pfVar4;
  pfVar10 = pfVar4;
  for (uVar11 = 1; pfVar10 = pfVar10 + iVar1, uVar11 < (ulong)(long)iVar2; uVar11 = uVar11 + 1) {
    iVar6 = 0;
    for (lVar8 = 0; lVar8 != lVar5; lVar8 = lVar8 + 1) {
      iVar6 = iVar6 + (uint)puVar7[lVar8];
      pfVar10[lVar8] = (float)((int)pfVar12[lVar8] + iVar6);
    }
    pfVar12 = pfVar12 + iVar1;
    puVar7 = puVar7 + lVar5;
  }
  for (uVar11 = 0; uVar11 != (long)iVar2; uVar11 = uVar11 + 1) {
    for (lVar8 = 0; lVar5 != lVar8; lVar8 = lVar8 + 1) {
      auVar3 = vcvtusi2ss_avx512f(in_XMM2,pfVar4[lVar8]);
      pfVar4[lVar8] = auVar3._0_4_ * 0.003921569;
    }
    pfVar4 = pfVar4 + iVar1;
  }
  return;
}

Assistant:

void compute_integral_img_int(uint8_t *gray_image, struct integral_image *iimage) {

    uint32_t *iimage_idata = (uint32_t *) iimage->data;

    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    uint32_t row_sum = 0;

    /* sum up the first row */
    for (size_t i = 0; i < width; ++i) {
        /* previous rows are 0 */
        row_sum += gray_image[i];
        iimage_idata[i] = row_sum;
    }

    /* sum all remaining rows*/
    for (size_t j = 1; j < height; ++j) {
        row_sum = 0;
        for (size_t i = 0; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            /*add sum of current row until current idx to sum of all previous rows until current index */
            iimage_idata[j * data_width + i] = row_sum + iimage_idata[(j - 1) * data_width + i];
        }
    }

    
    float *iimage_data = iimage->data;

    for (size_t j = 0; j < height; ++j) {
        for (size_t i = 0; i < width; ++i) {
            //iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
            iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
            //iimage_data[j * data_width + i] = ((float) iimage_idata[j * data_width + i]) / 255.0f;
        }
    }
    

}